

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::copy_cut_border_image(Mat *src,Mat *dst,int top,int left)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  int x;
  int y;
  float *outptr;
  float *ptr;
  int h;
  int w;
  int local_38;
  int local_34;
  float *local_30;
  float *local_28;
  
  iVar1 = in_RSI->w;
  iVar2 = in_RSI->h;
  local_28 = Mat::row(in_RDI,in_EDX);
  local_28 = local_28 + in_ECX;
  local_30 = Mat::operator_cast_to_float_(in_RSI);
  for (local_34 = 0; local_34 < iVar2; local_34 = local_34 + 1) {
    if (iVar1 < 0xc) {
      for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
        local_30[local_38] = local_28[local_38];
      }
    }
    else {
      memcpy(local_30,local_28,(long)iVar1 << 2);
    }
    local_30 = local_30 + iVar1;
    local_28 = local_28 + in_RDI->w;
  }
  return;
}

Assistant:

static void copy_cut_border_image(const Mat& src, Mat& dst, int top, int left)
{
    int w = dst.w;
    int h = dst.h;

    const float* ptr = src.row(top) + left;//.data + src.w * top + left;
    float* outptr = dst;//.data;

    for (int y = 0; y < h; y++)
    {
        if(w < 12)
        {
            for (int x = 0; x < w; x++)
            {
                outptr[x] = ptr[x];
            }
        }
        else
        {
            memcpy(outptr, ptr, w*sizeof(float));
        }
        outptr += w;
        ptr += src.w;
    }
}